

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O2

size_t license::mstrnlen_s(char *szptr,size_t maxsize)

{
  size_t sVar1;
  
  sVar1 = 0;
  if (szptr != (char *)0x0) {
    for (; (szptr[sVar1] != '\0' && (maxsize != sVar1)); sVar1 = sVar1 + 1) {
    }
  }
  return sVar1;
}

Assistant:

size_t mstrnlen_s(const char *szptr, size_t maxsize) {
	if (szptr == nullptr) {
		return 0;
	}
	size_t count = 0;
	while (*szptr++ && maxsize--) {
		count++;
	}
	return count;
}